

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

int armci_stride_info_seg_off(stride_info_t *sinfo)

{
  int iVar1;
  long lVar2;
  
  if (sinfo == (stride_info_t *)0x0) {
    __assert_fail("sinfo!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x89,"int armci_stride_info_seg_off(stride_info_t *)");
  }
  if (0 < (long)sinfo->stride_levels) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + sinfo->stride_arr[lVar2] * sinfo->itr[lVar2];
      lVar2 = lVar2 + 1;
    } while (sinfo->stride_levels != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int armci_stride_info_seg_off(stride_info_t *sinfo) {
  int i;
  int off;
  assert(sinfo!=NULL);
  
  off=0;
  for(i=0; i<sinfo->stride_levels; i++) {
    off += sinfo->itr[i] * sinfo->stride_arr[i];
  }
  return off;
}